

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_SubDVertex::GetBoundaryVertexEdgeIndices(ON_SubDVertex *this,uint *vei0,uint *vei1)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint vbi [2];
  
  vbi[0] = 0;
  vbi[1] = 0;
  uVar1 = this->m_edge_count;
  if ((ulong)uVar1 != 0) {
    pOVar2 = this->m_edges;
    uVar4 = 0;
    uVar5 = 0;
    do {
      if (*(short *)((pOVar2[uVar4].m_ptr & 0xfffffffffffffff8) + 100) == 1) {
        if (1 < uVar5) goto LAB_005c7e68;
        uVar6 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        vbi[uVar6] = (uint)uVar4;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    bVar3 = true;
    if (uVar5 == 2) goto LAB_005c7e73;
  }
LAB_005c7e68:
  vbi[0] = 0xffffffff;
  vbi[1] = 0xffffffff;
  bVar3 = false;
LAB_005c7e73:
  if (vei0 != (uint *)0x0) {
    *vei0 = vbi[0];
  }
  if (vei1 != (uint *)0x0) {
    *vei1 = vbi[1];
  }
  return bVar3;
}

Assistant:

bool ON_SubDVertex::GetBoundaryVertexEdgeIndices(
  unsigned* vei0,
  unsigned* vei1
) const
{
  unsigned int vbi_count = 0;
  unsigned int vbi[2] = {};
  for (unsigned short vei = 0; vei < m_edge_count; vei++)
  {
    const ON_SubDEdge* e = m_edges[vei].Edge();
    if (1 == e->m_face_count)
    {
      if (vbi_count < 2)
        vbi[vbi_count++] = vei;
      else
      {
        vbi_count = 0;
        break;
      }
    }
  }
  if (2 != vbi_count)
    vbi[0] = vbi[1] = ON_UNSET_UINT_INDEX;
  if (nullptr != vei0)
    *vei0 = vbi[0];
  if (nullptr != vei1)
    *vei1 = vbi[1];
  return (2 == vbi_count);
}